

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O2

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_48;
  
  (**mb->_vptr_ModelBin)(&MStack_48,mb,(ulong)(uint)this->bias_data_size,1);
  Mat::operator=(&this->bias_data,&MStack_48);
  Mat::~Mat(&MStack_48);
  if (((this->bias_data).data == (void *)0x0) ||
     (iVar1 = 0, (long)(this->bias_data).c * (this->bias_data).cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}